

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::flip32(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  triface *t2;
  badface **fstack;
  tetrahedron ppdVar1;
  tetrahedron p1;
  tetrahedron ppdVar2;
  memorypool *pmVar3;
  long lVar4;
  double *pdVar5;
  tetgenio *ptVar6;
  flipconstraints *pfVar7;
  tetrahedron p2;
  tetgenmesh *p3;
  long lVar8;
  tetrahedron *pppdVar9;
  tetrahedron *pppdVar10;
  tetrahedron *pppdVar11;
  ulong uVar12;
  int iVar13;
  face *s;
  undefined7 uVar14;
  tetgenmesh *this_00;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  char cVar18;
  triface *t;
  undefined8 uVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  triface local_1b0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  flipconstraints *local_190;
  tetrahedron local_188;
  tetrahedron local_180;
  tetgenmesh *local_178;
  face checkseg;
  triface casface;
  ulong local_140;
  face checksh;
  triface local_118 [2];
  long lStack_f0;
  triface local_e8 [3];
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 local_90;
  face local_88;
  face local_78;
  face flipshs [3];
  
  lVar8 = 8;
  do {
    *(undefined8 *)((long)&checksh.shver + lVar8) = 0;
    *(undefined4 *)((long)&local_118[0].tet + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  lVar8 = 8;
  do {
    *(undefined8 *)((long)&lStack_f0 + lVar8) = 0;
    *(undefined4 *)((long)&local_e8[0].tet + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  local_1b0.tet = (tetrahedron *)0x0;
  local_1b0.ver = 0;
  casface.tet = (tetrahedron *)0x0;
  casface.ver = 0;
  lVar8 = 8;
  do {
    *(undefined8 *)((long)flipshs + lVar8 + -8) = 0;
    *(undefined4 *)((long)&flipshs[0].sh + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  checkseg.sh = (shellface *)0x0;
  checkseg.shver = 0;
  pppdVar10 = fliptets->tet;
  pppdVar9 = pppdVar10;
  if (hullflag < 1) {
    pppdVar11 = fliptets[1].tet;
    iVar16 = fliptets[1].ver;
LAB_00114a3e:
    local_194 = 0;
LAB_00114a4e:
    local_198 = 0;
    local_19c = 0;
  }
  else {
    iVar13 = fliptets->ver;
    ppdVar1 = (tetrahedron)this->dummypoint;
    if (pppdVar10[orgpivot[iVar13]] == ppdVar1) {
      for (lVar8 = 8; lVar8 != 0x38; lVar8 = lVar8 + 0x10) {
        *(int *)((long)&fliptets->tet + lVar8) = esymtbl[*(int *)((long)&fliptets->tet + lVar8)];
      }
      local_1b0.tet = fliptets[1].tet;
      local_1b0.ver = fliptets[1].ver;
      pppdVar11 = fliptets[2].tet;
      fliptets[1].tet = pppdVar11;
      iVar16 = fliptets[2].ver;
      fliptets[1].ver = iVar16;
      fliptets[2].tet = local_1b0.tet;
      fliptets[2].ver = local_1b0.ver;
      uVar14 = (undefined7)((ulong)local_1b0.tet >> 8);
      local_194 = (undefined4)CONCAT71(uVar14,1);
      local_19c = 0;
      local_198 = (undefined4)CONCAT71(uVar14,1);
    }
    else {
      if (pppdVar10[apexpivot[iVar13]] != ppdVar1) {
        pppdVar11 = fliptets[1].tet;
        iVar16 = fliptets[1].ver;
        if (pppdVar11[apexpivot[iVar16]] != ppdVar1) goto LAB_00114a3e;
        pppdVar9 = fliptets[2].tet;
        fliptets->tet = pppdVar9;
        fliptets->ver = fliptets[2].ver;
        fliptets[2].tet = pppdVar11;
        fliptets[2].ver = iVar16;
        fliptets[1].tet = pppdVar10;
        fliptets[1].ver = iVar13;
        local_194 = (undefined4)CONCAT71((int7)((ulong)pppdVar11 >> 8),1);
        pppdVar11 = pppdVar10;
        iVar16 = iVar13;
        local_1b0.tet = pppdVar10;
        local_1b0.ver = iVar13;
        goto LAB_00114a4e;
      }
      pppdVar9 = fliptets[1].tet;
      fliptets->tet = pppdVar9;
      fliptets->ver = fliptets[1].ver;
      pppdVar11 = fliptets[2].tet;
      fliptets[1].tet = pppdVar11;
      iVar16 = fliptets[2].ver;
      fliptets[1].ver = iVar16;
      fliptets[2].tet = pppdVar10;
      fliptets[2].ver = iVar13;
      local_194 = (undefined4)CONCAT71((int7)((ulong)pppdVar10 >> 8),1);
      local_198 = 0;
      local_19c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar13 >> 8),1);
      local_1b0.tet = pppdVar10;
      local_1b0.ver = iVar13;
    }
  }
  iVar13 = fliptets->ver;
  local_178 = (tetgenmesh *)pppdVar9[apexpivot[iVar13]];
  local_180 = pppdVar11[apexpivot[iVar16]];
  ppdVar1 = fliptets[2].tet[apexpivot[fliptets[2].ver]];
  p1 = pppdVar9[destpivot[iVar13]];
  local_188 = pppdVar9[orgpivot[iVar13]];
  this->flip32count = this->flip32count + 1;
  t2 = fliptets + 1;
  local_190 = fc;
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    casface.tet = *(tetrahedron **)((long)&fliptets->tet + lVar8);
    casface.ver = eorgoppotbl[*(int *)((long)&fliptets->ver + lVar8)];
    fsym(this,&casface,(triface *)((long)&local_118[0].tet + lVar8));
  }
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    casface.tet = *(tetrahedron **)((long)&fliptets->tet + lVar8);
    casface.ver = edestoppotbl[*(int *)((long)&fliptets->ver + lVar8)];
    fsym(this,&casface,(triface *)((long)&local_e8[0].tet + lVar8));
  }
  uVar19 = 0;
  if (this->checksubfaceflag == 0) {
    local_140._0_4_ = -1;
  }
  else {
    iVar16 = 0;
    local_140 = 0xffffffffffffffff;
    s = flipshs;
    t = fliptets;
    for (uVar17 = 0; uVar17 != 3; uVar17 = uVar17 + 1) {
      tspivot(this,t,s);
      if (s->sh == (shellface *)0x0) {
        local_140 = uVar17 & 0xffffffff;
      }
      else {
        s->sh[9] = (shellface)0x0;
        s->sh[10] = (shellface)0x0;
        iVar16 = iVar16 + 1;
      }
      s = s + 1;
      t = t + 1;
    }
    uVar19 = CONCAT71((int7)((ulong)t >> 8),0 < iVar16);
  }
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  pppdVar10 = fliptets->tet;
  *(undefined4 *)((long)pppdVar10 + (long)this->elemmarkerindex * 4) = 0;
  pppdVar9 = fliptets[1].tet;
  *(undefined4 *)((long)pppdVar9 + (long)this->elemmarkerindex * 4) = 0;
  if (this->checksubsegflag != 0) {
    ppdVar2 = pppdVar10[8];
    if (ppdVar2 != (tetrahedron)0x0) {
      pmVar3 = this->tet2segpool;
      *ppdVar2 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar2;
      pmVar3->items = pmVar3->items + -1;
      fliptets->tet[8] = (tetrahedron)0x0;
      pppdVar9 = fliptets[1].tet;
    }
    ppdVar2 = pppdVar9[8];
    if (ppdVar2 != (tetrahedron)0x0) {
      pmVar3 = this->tet2segpool;
      *ppdVar2 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar2;
      pmVar3->items = pmVar3->items + -1;
      t2->tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    ppdVar2 = fliptets->tet[9];
    if (ppdVar2 != (tetrahedron)0x0) {
      pmVar3 = this->tet2subpool;
      *ppdVar2 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar2;
      pmVar3->items = pmVar3->items + -1;
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    ppdVar2 = t2->tet[9];
    if (ppdVar2 != (tetrahedron)0x0) {
      pmVar3 = this->tet2subpool;
      *ppdVar2 = (double *)pmVar3->deaditemstack;
      pmVar3->deaditemstack = ppdVar2;
      pmVar3->items = pmVar3->items + -1;
      t2->tet[9] = (tetrahedron)0x0;
    }
    uVar17 = 0;
    cVar18 = (char)uVar19;
    uVar19 = 0;
    if (cVar18 != '\0') {
      iVar16 = this->b->varvolume;
      iVar13 = this->volumeboundindex;
      uVar12 = (ulong)(uint)this->numelemattrib;
      if (this->numelemattrib < 1) {
        uVar12 = uVar17;
      }
      for (; uVar17 != 2; uVar17 = uVar17 + 1) {
        lVar8 = (long)this->elemattribindex;
        uVar15 = uVar12;
        while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
          fliptets[uVar17].tet[lVar8] = fliptets[(int)local_140].tet[lVar8];
          lVar8 = lVar8 + 1;
        }
        if (iVar16 != 0) {
          fliptets[uVar17].tet[iVar13] = fliptets[(int)local_140].tet[iVar13];
        }
      }
      uVar19 = 1;
    }
  }
  tetrahedrondealloc(this,fliptets[2].tet);
  p3 = local_178;
  p2 = local_180;
  ppdVar2 = local_188;
  if (hullflag < 1) {
    lVar8 = (long)fliptets->ver;
    fliptets->tet[orgpivot[lVar8]] = (tetrahedron)local_178;
    fliptets->tet[destpivot[lVar8]] = local_180;
    pppdVar10 = fliptets->tet;
    iVar16 = apexpivot[lVar8];
LAB_00114eb5:
    pppdVar10[iVar16] = ppdVar1;
    fliptets->tet[oppopivot[lVar8]] = p1;
    iVar16 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar16]] = local_180;
    fliptets[1].tet[destpivot[iVar16]] = (tetrahedron)local_178;
    fliptets[1].tet[apexpivot[iVar16]] = ppdVar1;
    fliptets[1].tet[oppopivot[iVar16]] = local_188;
    this_00 = local_178;
  }
  else {
    if (ppdVar1 != (tetrahedron)this->dummypoint) {
      if (p1 == (tetrahedron)this->dummypoint) {
        this->hullsize = this->hullsize + -2;
      }
      lVar8 = (long)fliptets->ver;
      fliptets->tet[orgpivot[lVar8]] = (tetrahedron)local_178;
      fliptets->tet[destpivot[lVar8]] = local_180;
      pppdVar10 = fliptets->tet;
      iVar16 = apexpivot[lVar8];
      goto LAB_00114eb5;
    }
    iVar16 = fliptets->ver;
    fliptets->tet[orgpivot[iVar16]] = local_180;
    fliptets->tet[destpivot[iVar16]] = (tetrahedron)local_178;
    fliptets->tet[apexpivot[iVar16]] = p1;
    fliptets->tet[oppopivot[iVar16]] = ppdVar1;
    iVar13 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar13]] = (tetrahedron)local_178;
    fliptets[1].tet[destpivot[iVar13]] = local_180;
    this_00 = (tetgenmesh *)(long)apexpivot[iVar13];
    fliptets[1].tet[(long)this_00] = local_188;
    fliptets[1].tet[oppopivot[iVar13]] = ppdVar1;
    fliptets->ver = esymtbl[iVar16];
    fliptets[1].ver = esymtbl[iVar13];
  }
  local_90 = uVar19;
  if (local_190->remove_ndelaunay_edge == 0) goto LAB_00115108;
  if (ppdVar1 == (tetrahedron)this->dummypoint) {
    dVar22 = tetprismvol(this_00,(double *)local_188,(double *)p1,(double *)local_178,
                         (double *)local_180);
    dVar21 = 0.0;
LAB_001150e5:
    dVar24 = 0.0;
    dVar23 = 0.0;
    dVar25 = 0.0;
  }
  else {
    if (p1 == (tetrahedron)this->dummypoint) {
      dVar21 = tetprismvol(this_00,(double *)local_180,(double *)local_178,(double *)ppdVar1,
                           (double *)local_188);
      dVar22 = 0.0;
      goto LAB_001150e5;
    }
    local_98 = tetprismvol(this_00,(double *)local_188,(double *)p1,(double *)local_178,
                           (double *)local_180);
    local_a0 = tetprismvol(this_00,(double *)ppdVar2,(double *)p1,(double *)p2,(double *)ppdVar1);
    local_a8 = tetprismvol(this_00,(double *)ppdVar2,(double *)p1,(double *)ppdVar1,(double *)p3);
    local_b0 = tetprismvol(this_00,(double *)p3,(double *)p2,(double *)ppdVar1,(double *)p1);
    dVar21 = tetprismvol(this_00,(double *)p2,(double *)p3,(double *)ppdVar1,(double *)ppdVar2);
    dVar22 = local_98;
    dVar23 = local_a0;
    dVar24 = local_a8;
    dVar25 = local_b0;
  }
  local_190->tetprism_vol_sum =
       ((((dVar21 + dVar25) - dVar22) - dVar23) - dVar24) + local_190->tetprism_vol_sum;
LAB_00115108:
  bond(this,fliptets,t2);
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    local_1b0.tet = fliptets->tet;
    local_1b0.ver = esymtbl[fliptets->ver];
    bond(this,&local_1b0,(triface *)((long)&local_118[0].tet + lVar8));
    fliptets->ver = enexttbl[fliptets->ver];
  }
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    local_1b0.tet = fliptets[1].tet;
    local_1b0.ver = esymtbl[fliptets[1].ver];
    bond(this,&local_1b0,(triface *)((long)&local_e8[0].tet + lVar8));
    fliptets[1].ver = eprevtbl[fliptets[1].ver];
  }
  if (this->checksubsegflag != 0) {
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
      lVar4 = *(long *)(*(long *)((long)&local_118[0].tet + lVar8) + 0x40);
      if ((lVar4 != 0) &&
         (*(long *)(lVar4 + (long)ver2edge[*(int *)((long)&local_118[0].ver + lVar8)] * 8) != 0)) {
        tsspivot1(this,(triface *)((long)&local_118[0].tet + lVar8),&checkseg);
        tssbond1(this,fliptets,&checkseg);
        checkseg.sh[9] = (shellface)((long)fliptets->ver | (ulong)fliptets->tet);
        tssbond1(this,t2,&checkseg);
        checkseg.sh[9] = (shellface)((long)fliptets[1].ver | (ulong)fliptets[1].tet);
        if ((local_190->chkencflag & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,&checkseg);
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
      fliptets[1].ver = eprevtbl[fliptets[1].ver];
    }
    for (lVar8 = 8; lVar8 != 0x38; lVar8 = lVar8 + 0x10) {
      local_1b0.tet = fliptets->tet;
      local_1b0.ver = eprevtbl[esymtbl[fliptets->ver]];
      casface.tet = *(tetrahedron **)((long)&checksh.shver + lVar8);
      casface.ver = enexttbl[*(int *)((long)&local_118[0].tet + lVar8)];
      if ((casface.tet[8] != (tetrahedron)0x0) &&
         (pdVar5 = casface.tet[8][ver2edge[casface.ver]], pdVar5 != (double *)0x0)) {
        checkseg.shver = (uint)pdVar5 & 7;
        checkseg.sh = (shellface *)((ulong)pdVar5 & 0xfffffffffffffff8);
        tssbond1(this,&local_1b0,&checkseg);
        checkseg.sh[9] = (shellface)((long)local_1b0.ver | (ulong)local_1b0.tet);
        if ((local_190->chkencflag & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,&checkseg);
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
    }
    for (lVar8 = 8; lVar8 != 0x38; lVar8 = lVar8 + 0x10) {
      local_1b0.tet = fliptets[1].tet;
      local_1b0.ver = enexttbl[esymtbl[fliptets[1].ver]];
      casface.tet = *(tetrahedron **)((long)&lStack_f0 + lVar8);
      casface.ver = eprevtbl[*(int *)((long)&local_e8[0].tet + lVar8)];
      if ((casface.tet[8] != (tetrahedron)0x0) &&
         (pdVar5 = casface.tet[8][ver2edge[casface.ver]], pdVar5 != (double *)0x0)) {
        checkseg.shver = (uint)pdVar5 & 7;
        checkseg.sh = (shellface *)((ulong)pdVar5 & 0xfffffffffffffff8);
        tssbond1(this,&local_1b0,&checkseg);
        checkseg.sh[9] = (shellface)((long)local_1b0.ver | (ulong)local_1b0.tet);
        if ((local_190->chkencflag & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,&checkseg);
        }
      }
      fliptets[1].ver = eprevtbl[fliptets[1].ver];
    }
  }
  if (this->checksubfaceflag != 0) {
    checksh.sh = (shellface *)0x0;
    checksh.shver = 0;
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
      lVar4 = *(long *)(*(long *)((long)&local_118[0].tet + lVar8) + 0x48);
      if ((lVar4 != 0) &&
         (*(long *)(lVar4 + (ulong)(*(uint *)((long)&local_118[0].ver + lVar8) & 3) * 8) != 0)) {
        tspivot(this,(triface *)((long)&local_118[0].tet + lVar8),&checksh);
        local_1b0.tet = fliptets->tet;
        local_1b0.ver = esymtbl[fliptets->ver];
        checksh.shver = checksh.shver ^ 1;
        tsbond(this,&local_1b0,&checksh);
        if ((local_190->chkencflag & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,&checksh);
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
    }
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
      lVar4 = *(long *)(*(long *)((long)&local_e8[0].tet + lVar8) + 0x48);
      if ((lVar4 != 0) &&
         (*(long *)(lVar4 + (ulong)(*(uint *)((long)&local_e8[0].ver + lVar8) & 3) * 8) != 0)) {
        tspivot(this,(triface *)((long)&local_e8[0].tet + lVar8),&checksh);
        local_1b0.tet = fliptets[1].tet;
        local_1b0.ver = esymtbl[fliptets[1].ver];
        checksh.shver = checksh.shver ^ 1;
        tsbond(this,&local_1b0,&checksh);
        if ((local_190->chkencflag & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,&checksh);
        }
      }
      fliptets[1].ver = eprevtbl[fliptets[1].ver];
    }
    if ((char)local_90 != '\0') {
      uVar17 = (long)((int)local_140 + 1) % 3;
      iVar13 = (int)uVar17;
      local_88.sh = flipshs[iVar13].sh;
      local_88.shver = flipshs[iVar13].shver;
      iVar16 = ((int)local_140 + 2) % 3;
      local_78.sh = flipshs[iVar16].sh;
      local_78.shver = flipshs[iVar16].shver ^ 1;
      uVar12 = 0;
      flip22(this,&local_88,0,local_190->chkencflag);
      local_118[0].tet = fliptets->tet;
      iVar16 = fliptets->ver;
      local_e8[0].tet = fliptets[1].tet;
      local_e8[0].ver = fliptets[1].ver;
      if (0 < iVar13) {
        uVar12 = uVar17 & 0xffffffff;
      }
      while( true ) {
        iVar13 = (int)uVar12;
        uVar12 = (ulong)(iVar13 - 1);
        if (iVar13 == 0) break;
        iVar16 = enexttbl[iVar16];
        local_e8[0].ver = eprevtbl[local_e8[0].ver];
      }
      local_118[0].ver = esymtbl[iVar16];
      local_88.shver = local_88.shver ^ 1;
      tspivot(this,local_118,&checksh);
      if (checksh.sh == (shellface *)0x0) {
        tsbond(this,local_118,&local_88);
        pppdVar10 = local_118[0].tet + (local_118[0].ver & 3);
        local_118[0].tet = (tetrahedron *)((ulong)*pppdVar10 & 0xfffffffffffffff0);
        local_118[0].ver = fsymtbl[local_118[0].ver][(uint)*pppdVar10 & 0xf];
        local_88.shver = local_88.shver ^ 1;
        tsbond(this,local_118,&local_88);
      }
      else {
        terminatetetgen(this,2);
      }
      local_e8[0].ver = esymtbl[local_e8[0].ver];
      local_78.shver = local_78.shver ^ 1;
      tspivot(this,local_e8,&checksh);
      if (checksh.sh == (shellface *)0x0) {
        tsbond(this,local_e8,&local_78);
        pppdVar10 = local_e8[0].tet + (local_e8[0].ver & 3);
        local_e8[0].tet = (tetrahedron *)((ulong)*pppdVar10 & 0xfffffffffffffff0);
        local_e8[0].ver = fsymtbl[local_e8[0].ver][(uint)*pppdVar10 & 0xf];
        local_78.shver = local_78.shver ^ 1;
        tsbond(this,local_e8,&local_78);
      }
      else {
        terminatetetgen(this,2);
      }
    }
  }
  pfVar7 = local_190;
  if ((local_190->chkencflag & 4) != 0) {
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 0x10) {
      enqueuetetrahedron(this,(triface *)((long)&fliptets->tet + lVar8));
    }
  }
  ptVar6 = (tetgenio *)fliptets->tet;
  iVar16 = this->point2simindex;
  (&local_178->in)[iVar16] = ptVar6;
  local_180[iVar16] = (double *)ptVar6;
  pppdVar10 = fliptets->tet;
  ppdVar1[iVar16] = (double *)pppdVar10;
  p1[iVar16] = (double *)pppdVar10;
  pppdVar10 = fliptets[1].tet;
  local_188[iVar16] = (double *)pppdVar10;
  if (((byte)local_194 & 0 < hullflag) == 0) {
    iVar16 = fliptets->ver;
  }
  else if ((char)local_198 == '\0') {
    if ((char)local_19c == '\0') {
      iVar16 = enexttbl[fliptets->ver];
      fliptets->ver = iVar16;
      iVar13 = eprevtbl[fliptets[1].ver];
    }
    else {
      iVar16 = eprevtbl[fliptets->ver];
      fliptets->ver = iVar16;
      iVar13 = enexttbl[fliptets[1].ver];
    }
    fliptets[1].ver = iVar13;
  }
  else {
    pppdVar9 = fliptets->tet;
    iVar13 = fliptets->ver;
    fliptets->tet = pppdVar10;
    iVar16 = fliptets[1].ver;
    fliptets->ver = iVar16;
    fliptets[1].tet = pppdVar9;
    fliptets[1].ver = iVar13;
  }
  local_1b0.tet = fliptets->tet;
  if (0 < pfVar7->enqflag) {
    local_1b0.ver = enextesymtbl[iVar16];
    fstack = &this->flipstack;
    flippush(this,fstack,&local_1b0);
    local_1b0.tet = fliptets[1].tet;
    local_1b0.ver = eprevesymtbl[fliptets[1].ver];
    flippush(this,fstack,&local_1b0);
    local_1b0.tet = fliptets->tet;
    iVar16 = fliptets->ver;
    if (1 < pfVar7->enqflag) {
      local_1b0.ver = eprevesymtbl[iVar16];
      flippush(this,fstack,&local_1b0);
      local_1b0.tet = fliptets[1].tet;
      local_1b0.ver = enextesymtbl[fliptets[1].ver];
      flippush(this,fstack,&local_1b0);
      local_1b0.tet = fliptets->tet;
      local_1b0.ver = esymtbl[fliptets->ver];
      flippush(this,fstack,&local_1b0);
      local_1b0.tet = fliptets[1].tet;
      local_1b0.ver = esymtbl[fliptets[1].ver];
      flippush(this,fstack,&local_1b0);
      local_1b0.tet = fliptets->tet;
      iVar16 = fliptets->ver;
    }
  }
  (this->recenttet).tet = local_1b0.tet;
  (this->recenttet).ver = iVar16;
  return;
}

Assistant:

void tetgenmesh::flip32(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  face flipshs[3]; 
  face checkseg; 
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // Rangle = {-1, 0, 1, 2}
  int spivot = -1, scount = 0; // for flip22()
  int t1ver; 
  int i, j;

  if (hullflag > 0) {
    // Check if e is 'dummypoint'.
    if (org(fliptets[0]) == dummypoint) {
      // Reverse the edge.
      for (i = 0; i < 3; i++) {
        esymself(fliptets[i]);
      }
      // Swap the last two tets.
      newface = fliptets[1];
      fliptets[1] = fliptets[2];
      fliptets[2] = newface;
      dummyflag = -1; // e is dummypoint.
    } else {
      // Check if a or b is the 'dummypoint'.
      if (apex(fliptets[0]) == dummypoint) { 
        dummyflag = 1;  // a is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else if (apex(fliptets[1]) == dummypoint) {
        dummyflag = 2;  // b is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[2];
        fliptets[2] = fliptets[1];
        fliptets[1] = newface;
      } else {
        dummyflag = 0;  // either c or d may be dummypoint.
      }
    }
  }

  pa = apex(fliptets[0]);
  pb = apex(fliptets[1]);
  pc = apex(fliptets[2]);
  pd = dest(fliptets[0]);
  pe = org(fliptets[0]);

  flip32count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], casface);
    fsym(casface, topcastets[i]);
  }
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], casface);
    fsym(casface, botcastets[i]);
  }

  if (checksubfaceflag) {
    // Check if there are interior subfaces at the edge [e,d].
    for (i = 0; i < 3; i++) {
      tspivot(fliptets[i], flipshs[i]);
      if (flipshs[i].sh != NULL) {
        // Found an interior subface.
        stdissolve(flipshs[i]); // Disconnect the sub-tet bond.
        scount++;
      } else {
        spivot = i;
      }
    }
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  if (checksubfaceflag) {
    if (scount > 0) {
      // The element attributes and volume constraint must be set correctly.
      // There are two subfaces involved in this flip. The three tets are
      //   separated into two different regions, one may be exterior. The
      //   first region has two tets, and the second region has only one.
      //   The two created tets must be in the same region as the first region. 
      //   The element attributes and volume constraint must be set correctly.
      //assert(spivot != -1);
      // The tet fliptets[spivot] is in the first region.
      for (j = 0; j < 2; j++) {
        for (i = 0; i < numelemattrib; i++) {
          attrib = elemattribute(fliptets[spivot].tet, i);
          setelemattribute(fliptets[j].tet, i, attrib);
        }
        if (b->varvolume) {
          volume = volumebound(fliptets[spivot].tet);
          setvolumebound(fliptets[j].tet, volume);
        }
      }
    }
  }
  // Delete an old tet.
  tetrahedrondealloc(fliptets[2].tet);

  if (hullflag > 0) {
    // Check if c is dummypointc.
    if (pc != dummypoint) {
      // Check if d is dummypoint.
      if (pd != dummypoint) {
        // No hull tet is involved.
      } else {
        // We deleted three hull tets, and created one hull tet.
        hullsize -= 2;
      }
      setvertices(fliptets[0], pa, pb, pc, pd);
      setvertices(fliptets[1], pb, pa, pc, pe);
    } else {
      // c is dummypoint. The two new tets are hull tets.
      setvertices(fliptets[0], pb, pa, pd, pc);
      setvertices(fliptets[1], pa, pb, pe, pc);
      // Adjust badc -> abcd.
      esymself(fliptets[0]);
      // Adjust abec -> bace.
      esymself(fliptets[1]);
      // The hullsize does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
    setvertices(fliptets[1], pb, pa, pc, pe);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[3], volpos[2], vol_diff;
    if (pc != dummypoint) {
      if (pd != dummypoint) {
        volneg[0] = tetprismvol(pe, pd, pa, pb);
        volneg[1] = tetprismvol(pe, pd, pb, pc);
        volneg[2] = tetprismvol(pe, pd, pc, pa);
        volpos[0] = tetprismvol(pa, pb, pc, pd);
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volpos[0] = 0.;
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      }
    } else { // pc == dummypoint.
      volneg[0] = tetprismvol(pe, pd, pa, pb);
      volneg[1] = 0.;
      volneg[2] = 0.;
      volpos[0] = 0.;
      volpos[1] = 0.;
    }
    vol_diff = volpos[0] + volpos[1] - volneg[0] - volneg[1] - volneg[2];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond abcd <==> bace.
  bond(fliptets[0], fliptets[1]);
  // Bond new faces to top outer boundary faces (at abcd).
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface);
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  // Bond new faces to bottom outer boundary faces (at bace).
  for (i = 0; i < 3; i++) {
    esym(fliptets[1], newface);
    bond(newface, botcastets[i]);
    eprevself(fliptets[1]);
  }

  if (checksubsegflag) {
    // Bond 9 segments to new (flipped) tets.
    for (i = 0; i < 3; i++) { // edges a->b, b->c, c->a.      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        tssbond1(fliptets[1], checkseg);
        sstbond1(checkseg, fliptets[1]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
      eprevself(fliptets[1]);
    }
    // The three top edges.
    for (i = 0; i < 3; i++) { // edges b->d, c->d, a->d.
      esym(fliptets[0], newface);
      eprevself(newface); 
      enext(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    // The three bot edges.
    for (i = 0; i < 3; i++) { // edges b<-e, c<-e, a<-e.
      esym(fliptets[1], newface);
      enextself(newface); 
      eprev(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      eprevself(fliptets[1]);
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    face checksh;
    // Bond the top three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [b,a], [c,b], [a,c]
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        esym(fliptets[0], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    // Bond the bottom three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [a,b], [b,c], [c,a]
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        esym(fliptets[1], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      eprevself(fliptets[1]);
    }

    if (scount > 0) {
      face flipfaces[2];
      // Perform a 2-to-2 flip in subfaces.
      flipfaces[0] = flipshs[(spivot + 1) % 3];
      flipfaces[1] = flipshs[(spivot + 2) % 3];
      sesymself(flipfaces[1]);
      flip22(flipfaces, 0, fc->chkencflag);
      // Connect the flipped subfaces to flipped tets.
      // First go to the corresponding flipping edge.
      //   Re-use top- and botcastets[0].
      topcastets[0] = fliptets[0];
      botcastets[0] = fliptets[1];
      for (i = 0; i < ((spivot + 1) % 3); i++) {
        enextself(topcastets[0]);
        eprevself(botcastets[0]);
      }
      // Connect the top subface to the top tets.
      esymself(topcastets[0]);
      sesymself(flipfaces[0]);
      // Check if there already exists a subface.
      tspivot(topcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(topcastets[0], flipfaces[0]);
        fsymself(topcastets[0]);
        sesymself(flipfaces[0]);
        tsbond(topcastets[0], flipfaces[0]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2); 
      }
      // Connect the bot subface to the bottom tets.
      esymself(botcastets[0]);
      sesymself(flipfaces[1]);
      // Check if there already exists a subface.
      tspivot(botcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(botcastets[0], flipfaces[1]);
        fsymself(botcastets[0]);
        sesymself(flipfaces[1]);
        tsbond(botcastets[0], flipfaces[1]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2);  
      }
    } // if (scount > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put two new tets into check list.
    for (i = 0; i < 2; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[1].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) {
        // e were dummypoint. Swap the two new tets.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = newface;
      } else {
        // a or b was dummypoint.
        if (dummyflag == 1) {
          eprevself(fliptets[0]);
          enextself(fliptets[1]);
        } else { // dummyflag == 2
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }
      }
    }
  }
  
  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    // pa = org(fliptets[0]); // 'a' may be a new vertex.
    enextesym(fliptets[0], newface);
    flippush(flipstack, &newface);
    eprevesym(fliptets[1], newface);
    flippush(flipstack, &newface);
    if (fc->enqflag > 1) {
      //pb = dest(fliptets[0]);
      eprevesym(fliptets[0], newface);
      flippush(flipstack, &newface);
      enextesym(fliptets[1], newface);
      flippush(flipstack, &newface);
      //pc = apex(fliptets[0]);
      esym(fliptets[0], newface);
      flippush(flipstack, &newface);
      esym(fliptets[1], newface);
      flippush(flipstack, &newface);
    }
  }

  recenttet = fliptets[0];
}